

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

void __thiscall BpTree<int>::InsertKey(BpTree<int> *this,int k,Addr p)

{
  int iVar1;
  pointer pcVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  Addr Cp;
  IndexNode<int> B;
  IndexNode<int> T;
  IndexNode<int> A;
  IndexNode<int> D;
  Addr local_2d0;
  IndexNode<int> local_2c8;
  IndexNode<int> local_268;
  IndexNode<int> local_208;
  IndexNode<int> local_1a8;
  IndexNode<int> local_148;
  IndexNode<int> local_e8;
  IndexNode<int> local_88;
  
  IndexNode<int>::IndexNode(&local_e8,this->N);
  if ((this->RootAddr).FileOff == -1) {
    local_e8.NodeState = '1';
    local_e8.parent.BlockNum = -1;
    local_e8.parent.FileOff = -1;
    *local_e8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
     _M_start = '1';
    *local_e8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = k;
    *local_e8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
     _M_start = p;
    InsertNode(this,&local_e8);
    this->RootAddr = local_e8.self;
    local_148.NodeState = local_e8.NodeState;
    std::vector<int,_std::allocator<int>_>::vector(&local_148.k,&local_e8.k);
    local_148.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_148.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_148.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
              (&local_148.v.super__Vector_base<char,_std::allocator<char>_>,
               (long)local_e8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_e8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    pcVar2 = local_148.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar8 = (long)local_e8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_e8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (sVar8 != 0) {
      memmove(local_148.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start,
              local_e8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start,sVar8);
    }
    local_148.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2 + sVar8;
    std::vector<Addr,_std::allocator<Addr>_>::vector(&local_148.p,&local_e8.p);
    local_148.parent = local_e8.parent;
    local_148.self = local_e8.self;
    UpdateBlock(this,&local_148);
    if (local_148.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_148.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_148.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_148.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_148.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_148.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_148.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_148.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    FindFirstKey(this,k,&local_2d0);
    IndexNode<int>::IndexNode(&local_208,this->N);
    FindNode(this,local_2d0,&local_208);
    if (local_208.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[(long)this->N + -2] == '0') {
      Insert_Leaf(this,&local_208,k,p);
      local_1a8.NodeState = local_208.NodeState;
      std::vector<int,_std::allocator<int>_>::vector(&local_1a8.k,&local_208.k);
      local_1a8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1a8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1a8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
                (&local_1a8.v.super__Vector_base<char,_std::allocator<char>_>,
                 (long)local_208.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_208.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
      pcVar2 = local_1a8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar8 = (long)local_208.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_208.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (sVar8 != 0) {
        memmove(local_1a8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,
                local_208.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,sVar8);
      }
      local_1a8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar2 + sVar8;
      std::vector<Addr,_std::allocator<Addr>_>::vector(&local_1a8.p,&local_208.p);
      local_1a8.parent = local_208.parent;
      local_1a8.self = local_208.self;
      UpdateBlock(this,&local_1a8);
      if (local_1a8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1a8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_2c8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_1a8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_2c8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_1a8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
      if (local_1a8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1a8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
        local_2c8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = local_1a8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_2c8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             local_1a8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      }
    }
    else {
      InsertNode(this,&local_e8);
      IndexNode<int>::IndexNode(&local_2c8,this->N);
      IndexNode<int>::IndexNode(&local_88,this->N);
      FindNode(this,local_2d0,&local_2c8);
      FindNode(this,local_e8.self,&local_88);
      local_268.NodeState = local_2c8.NodeState;
      std::vector<int,_std::allocator<int>_>::vector(&local_268.k,&local_2c8.k);
      local_268.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_268.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_268.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
                (&local_268.v.super__Vector_base<char,_std::allocator<char>_>,
                 (long)local_2c8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_2c8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
      pcVar2 = local_268.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar8 = (long)local_2c8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_2c8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (sVar8 != 0) {
        memmove(local_268.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,
                local_2c8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,sVar8);
      }
      local_268.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar2 + sVar8;
      std::vector<Addr,_std::allocator<Addr>_>::vector(&local_268.p,&local_2c8.p);
      local_268.parent = local_2c8.parent;
      local_268.self = local_2c8.self;
      Insert_Leaf(this,&local_268,k,p);
      if (1 < this->N) {
        lVar4 = 0;
        do {
          local_2c8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start[lVar4].BlockNum = -1;
          local_2c8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start[lVar4].FileOff = -1;
          local_2c8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar4] = '0';
          lVar4 = lVar4 + 1;
        } while (lVar4 < (long)this->N + -1);
      }
      iVar1 = this->N;
      uVar5 = 0;
      if (0 < (int)((uint)((int)(iVar1 - (iVar1 >> 0x1f) & 0xfffffffeU) < iVar1) + iVar1 / 2)) {
        do {
          local_2c8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5] =
               local_268.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5];
          local_2c8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar5] =
               local_268.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5];
          local_2c8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5] = '1';
          uVar5 = uVar5 + 1;
          iVar1 = this->N;
        } while ((long)uVar5 <
                 (long)(int)((uint)((int)(iVar1 - (iVar1 >> 0x1f) & 0xfffffffeU) < iVar1) +
                            iVar1 / 2));
      }
      uVar7 = this->N;
      uVar6 = (ulong)uVar7;
      if ((int)uVar5 < (int)uVar7) {
        uVar5 = uVar5 & 0xffffffff;
        do {
          uVar7 = ((uint)(uVar6 >> 0x1f) & 1) + (int)uVar6;
          iVar3 = (int)uVar5;
          local_88.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data
          ._M_start[(int)(iVar3 - ((uint)((int)(uVar7 & 0xfffffffe) < (int)uVar6) +
                                  ((int)uVar7 >> 1)))] =
               local_268.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5];
          iVar1 = this->N;
          local_88.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(int)(iVar3 - ((uint)((int)(iVar1 - (iVar1 >> 0x1f) & 0xfffffffeU) < iVar1) +
                                 iVar1 / 2))] =
               local_268.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5];
          iVar1 = this->N;
          local_88.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_start[(int)(iVar3 - ((uint)((int)(iVar1 - (iVar1 >> 0x1f) & 0xfffffffeU) < iVar1) +
                                  iVar1 / 2))] = '1';
          uVar5 = uVar5 + 1;
          uVar7 = this->N;
          uVar6 = (ulong)(int)uVar7;
        } while ((long)uVar5 < (long)uVar6);
      }
      local_88.NodeState = '1';
      lVar4 = (long)(int)uVar7;
      local_88.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar4 + -1].BlockNum =
           local_2c8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
           super__Vector_impl_data._M_start[lVar4 + -1].BlockNum;
      local_88.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar4 + -1].FileOff =
           local_2c8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
           super__Vector_impl_data._M_start[lVar4 + -1].FileOff;
      local_2c8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar4 + -1] = local_88.self;
      Insert_Parent(this,&local_2c8,
                    *local_88.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_88);
      if (local_268.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_268.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_268.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_268.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_268.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_268.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_268.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_268.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_268.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_268.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_268.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_268.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_88.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_88.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_88.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_88.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_88.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_88.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_2c8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2c8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2c8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2c8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_2c8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2c8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2c8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2c8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (local_2c8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2c8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2c8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2c8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_208.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_208.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_208.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_148.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_208.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_148.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_208.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    if (local_208.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_208.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_208.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
      local_148.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_208.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_148.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_208.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
    }
  }
  if (local_148.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (Addr *)0x0) {
    operator_delete(local_e8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BpTree<K>::InsertKey(K k, Addr p) {
	int i;
	IndexNode<K> C(N);
	if (this->RootAddr.FileOff == -1) {
		C.NodeState = LEAF;		//����
		C.parent = { -1, -1 };
		C.v[0] = '1';		C.k[0] = k;		C.p[0] = p;
		this->InsertNode(C);
		this->RootAddr = C.self;
		this->UpdateBlock(C);
		return;
	}
	Addr Cp;
	int temp = this->FindFirstKey(k, Cp);	//���ǿ���
	IndexNode<K> A(N);
	this->FindNode(Cp, A);
	if (A.v[N-2] == '0') {
		this->Insert_Leaf(A, k, p);		//�п�
		this->UpdateBlock(A);
		return;
	}
	this->InsertNode(C);				//������ˣ�����½��
	IndexNode<K> B(N);
	IndexNode<K> D(N);
	this->FindNode(Cp, B);
	this->FindNode(C.self, D);
	IndexNode<K> T = B;
	this->Insert_Leaf(T, k, p);
	for (i = 0; i < N - 1; i++) {
		B.p[i] = { -1, -1 };			//���B.p[0]��B.p[N - 2]
		B.v[i] = '0';					//���B.v[0]��B.v[N - 2]
	}
	for (i = 0; i < MIN_POINTS_NONLEAF; i++) {		//���¾ɽ��
		B.p[i] = T.p[i];
		B.k[i] = T.k[i];
		B.v[i] = '1';
	}
	for (; i < N; i++) {							//�����½��
		D.p[i - MIN_POINTS_NONLEAF] = T.p[i];
		D.k[i - MIN_POINTS_NONLEAF] = T.k[i];
		D.v[i - MIN_POINTS_NONLEAF] = '1';
	}
	D.NodeState = LEAF;
	D.p[N - 1].BlockNum = B.p[N - 1].BlockNum;	//�½�����ָ���������ϣ����Բ���ԭ������
	D.p[N - 1].FileOff = B.p[N - 1].FileOff;
	
	B.p[N - 1] = D.self;		//�ɽڵ���������������
	K k2 = D.k[0];
	Insert_Parent(B, k2, D);
}